

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_sent
          (bt_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer prVar4;
  element_type *this_00;
  int bytes_protocol;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  const_iterator local_58;
  __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
  local_50;
  const_iterator local_48;
  __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
  local_40;
  __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
  local_38;
  iterator i;
  iterator first_to_keep;
  int amount_payload;
  size_t bytes_transferred_local;
  error_code *error_local;
  bt_peer_connection *this_local;
  
  bVar3 = boost::system::error_code::operator_cast_to_bool(error);
  bytes_protocol = (int)bytes_transferred;
  if (bVar3) {
    peer_connection::sent_bytes(&this->super_peer_connection,0,bytes_protocol);
  }
  else {
    first_to_keep._M_current._4_4_ = 0;
    bVar3 = ::std::
            vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
            ::empty(&this->m_payloads);
    if (!bVar3) {
      i = ::std::
          vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
          ::begin(&this->m_payloads);
      local_38._M_current =
           (range *)::std::
                    vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
                    ::begin(&this->m_payloads);
      while( true ) {
        local_40._M_current =
             (range *)::std::
                      vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
                      ::end(&this->m_payloads);
        bVar3 = __gnu_cxx::operator!=(&local_38,&local_40);
        if (!bVar3) break;
        prVar4 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                 ::operator->(&local_38);
        prVar4->start = prVar4->start - bytes_protocol;
        prVar4 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                 ::operator->(&local_38);
        if (prVar4->start < 0) {
          prVar4 = __gnu_cxx::
                   __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                   ::operator->(&local_38);
          iVar1 = prVar4->start;
          prVar4 = __gnu_cxx::
                   __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                   ::operator->(&local_38);
          if (iVar1 + prVar4->length < 1) {
            prVar4 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                     ::operator->(&local_38);
            iVar1 = prVar4->length;
            __gnu_cxx::
            __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
            ::operator++(&i);
          }
          else {
            prVar4 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                     ::operator->(&local_38);
            iVar1 = -prVar4->start;
            prVar4 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                     ::operator->(&local_38);
            iVar2 = prVar4->start;
            prVar4 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                     ::operator->(&local_38);
            prVar4->length = prVar4->length + iVar2;
            prVar4 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
                     ::operator->(&local_38);
            prVar4->start = 0;
          }
          first_to_keep._M_current._4_4_ = iVar1 + first_to_keep._M_current._4_4_;
        }
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::bt_peer_connection::range_*,_std::vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>_>
        ::operator++(&local_38);
      }
      local_50._M_current =
           (range *)::std::
                    vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
                    ::begin(&this->m_payloads);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::bt_peer_connection::range_const*,std::vector<libtorrent::aux::bt_peer_connection::range,std::allocator<libtorrent::aux::bt_peer_connection::range>>>
      ::__normal_iterator<libtorrent::aux::bt_peer_connection::range*>
                ((__normal_iterator<libtorrent::aux::bt_peer_connection::range_const*,std::vector<libtorrent::aux::bt_peer_connection::range,std::allocator<libtorrent::aux::bt_peer_connection::range>>>
                  *)&local_48,&local_50);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::bt_peer_connection::range_const*,std::vector<libtorrent::aux::bt_peer_connection::range,std::allocator<libtorrent::aux::bt_peer_connection::range>>>
      ::__normal_iterator<libtorrent::aux::bt_peer_connection::range*>
                ((__normal_iterator<libtorrent::aux::bt_peer_connection::range_const*,std::vector<libtorrent::aux::bt_peer_connection::range,std::allocator<libtorrent::aux::bt_peer_connection::range>>>
                  *)&local_58,&i);
      t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ::std::
           vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
           ::erase(&this->m_payloads,local_48,local_58);
    }
    peer_connection::sent_bytes
              (&this->super_peer_connection,first_to_keep._M_current._4_4_,
               bytes_protocol - first_to_keep._M_current._4_4_);
    if (0 < first_to_keep._M_current._4_4_) {
      peer_connection::associated_torrent((peer_connection *)local_80);
      ::std::weak_ptr<libtorrent::aux::torrent>::lock
                ((weak_ptr<libtorrent::aux::torrent> *)local_70);
      ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                ((weak_ptr<libtorrent::aux::torrent> *)local_80);
      bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
      if (bVar3) {
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_70);
        torrent::update_last_upload(this_00);
      }
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)local_70);
    }
  }
  return;
}

Assistant:

void bt_peer_connection::on_sent(error_code const& error
		, std::size_t const bytes_transferred)
	{
		INVARIANT_CHECK;

		if (error)
		{
			sent_bytes(0, int(bytes_transferred));
			return;
		}

		// manage the payload markers
		int amount_payload = 0;
		if (!m_payloads.empty())
		{
			// this points to the first entry to not erase. i.e.
			// [begin, first_to_keep) will be erased because
			// the payload ranges they represent have been sent
			auto first_to_keep = m_payloads.begin();

			for (auto i = m_payloads.begin(); i != m_payloads.end(); ++i)
			{
				i->start -= int(bytes_transferred);
				if (i->start < 0)
				{
					if (i->start + i->length <= 0)
					{
						amount_payload += i->length;
						TORRENT_ASSERT(first_to_keep == i);
						++first_to_keep;
					}
					else
					{
						amount_payload += -i->start;
						i->length -= -i->start;
						i->start = 0;
					}
				}
			}

			// remove all payload ranges that have been sent
			m_payloads.erase(m_payloads.begin(), first_to_keep);
		}

		TORRENT_ASSERT(amount_payload <= int(bytes_transferred));
		sent_bytes(amount_payload, int(bytes_transferred) - amount_payload);

		if (amount_payload > 0)
		{
			auto t = associated_torrent().lock();
			TORRENT_ASSERT(t);
			if (t) t->update_last_upload();
		}
	}